

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

bool __thiscall cfd::Psbt::IsFindTxIn(Psbt *this,OutPoint *outpoint,uint32_t *index)

{
  uint32_t uVar1;
  string errmsg;
  
  core::OutPoint::GetTxid((Txid *)&errmsg,outpoint);
  uVar1 = core::OutPoint::GetVout(outpoint);
  uVar1 = core::Transaction::GetTxInIndex(&(this->super_Psbt).base_tx_,(Txid *)&errmsg,uVar1);
  core::Txid::~Txid((Txid *)&errmsg);
  if (index != (uint32_t *)0x0) {
    *index = uVar1;
  }
  return true;
}

Assistant:

bool Psbt::IsFindTxIn(const OutPoint& outpoint, uint32_t* index) const {
  static constexpr const char* const kErrorMessage = "Txid is not found.";
  try {
    uint32_t temp_index =
        base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if (errmsg == kErrorMessage) {
      return false;
    } else {
      throw except;
    }
  }
}